

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

int __thiscall capnp::TwoPartyServer::listen(TwoPartyServer *this,int __fd,int __n)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  ConnectionReceiver *local_40;
  undefined8 *local_38;
  Type local_30;
  undefined8 *local_20;
  ConnectionReceiver *listener_local;
  TwoPartyServer *this_local;
  
  local_20 = (undefined8 *)CONCAT44(in_register_00000014,__n);
  listener_local = (ConnectionReceiver *)CONCAT44(in_register_00000034,__fd);
  this_local = this;
  (**(code **)*local_20)();
  local_38 = local_20;
  local_40 = (ConnectionReceiver *)CONCAT44(in_register_00000034,__fd);
  kj::Promise<kj::Own<kj::AsyncIoStream>>::
  then<capnp::TwoPartyServer::listen(kj::ConnectionReceiver&)::__0,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)this,&local_30,(PropagateException *)&local_40);
  kj::Promise<kj::Own<kj::AsyncIoStream>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream>_> *)&local_30);
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::listen(kj::ConnectionReceiver& listener) {
  return listener.accept()
      .then([this,&listener](kj::Own<kj::AsyncIoStream>&& connection) mutable {
    accept(kj::mv(connection));
    return listen(listener);
  });
}